

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSequentialImpulseConstraintSolver.cpp
# Opt level: O2

btScalar gResolveSingleConstraintRowGeneric_scalar_reference
                   (btSolverBody *body1,btSolverBody *body2,btSolverConstraint *c)

{
  float fVar1;
  float fVar2;
  float fVar3;
  btScalar bVar4;
  btScalar bVar5;
  btScalar bVar6;
  btScalar bVar7;
  btVector3 local_40;
  
  fVar1 = c->m_appliedImpulse;
  fVar2 = c->m_cfm;
  fVar3 = c->m_rhs;
  bVar4 = btVector3::dot(&c->m_contactNormal1,&body1->m_deltaLinearVelocity);
  bVar5 = btVector3::dot(&c->m_relpos1CrossNormal,&body1->m_deltaAngularVelocity);
  bVar6 = btVector3::dot(&c->m_contactNormal2,&body2->m_deltaLinearVelocity);
  bVar7 = btVector3::dot(&c->m_relpos2CrossNormal,&body2->m_deltaAngularVelocity);
  bVar5 = ((fVar3 - fVar1 * fVar2) - (bVar5 + bVar4) * c->m_jacDiagABInv) -
          (bVar7 + bVar6) * c->m_jacDiagABInv;
  bVar4 = c->m_appliedImpulse + bVar5;
  fVar1 = c->m_lowerLimit;
  if ((bVar4 < c->m_lowerLimit) || (fVar1 = c->m_upperLimit, c->m_upperLimit < bVar4)) {
    bVar4 = fVar1;
    bVar5 = bVar4 - c->m_appliedImpulse;
  }
  c->m_appliedImpulse = bVar4;
  local_40 = operator*(&c->m_contactNormal1,&body1->m_invMass);
  btSolverBody::internalApplyImpulse(body1,&local_40,&c->m_angularComponentA,bVar5);
  local_40 = operator*(&c->m_contactNormal2,&body2->m_invMass);
  btSolverBody::internalApplyImpulse(body2,&local_40,&c->m_angularComponentB,bVar5);
  return bVar5;
}

Assistant:

static btSimdScalar gResolveSingleConstraintRowGeneric_scalar_reference(btSolverBody& body1, btSolverBody& body2, const btSolverConstraint& c)
{
	btScalar deltaImpulse = c.m_rhs - btScalar(c.m_appliedImpulse)*c.m_cfm;
	const btScalar deltaVel1Dotn = c.m_contactNormal1.dot(body1.internalGetDeltaLinearVelocity()) + c.m_relpos1CrossNormal.dot(body1.internalGetDeltaAngularVelocity());
	const btScalar deltaVel2Dotn = c.m_contactNormal2.dot(body2.internalGetDeltaLinearVelocity()) + c.m_relpos2CrossNormal.dot(body2.internalGetDeltaAngularVelocity());

	//	const btScalar delta_rel_vel	=	deltaVel1Dotn-deltaVel2Dotn;
	deltaImpulse -= deltaVel1Dotn*c.m_jacDiagABInv;
	deltaImpulse -= deltaVel2Dotn*c.m_jacDiagABInv;

	const btScalar sum = btScalar(c.m_appliedImpulse) + deltaImpulse;
	if (sum < c.m_lowerLimit)
	{
		deltaImpulse = c.m_lowerLimit - c.m_appliedImpulse;
		c.m_appliedImpulse = c.m_lowerLimit;
	}
	else if (sum > c.m_upperLimit)
	{
		deltaImpulse = c.m_upperLimit - c.m_appliedImpulse;
		c.m_appliedImpulse = c.m_upperLimit;
	}
	else
	{
		c.m_appliedImpulse = sum;
	}

	body1.internalApplyImpulse(c.m_contactNormal1*body1.internalGetInvMass(), c.m_angularComponentA, deltaImpulse);
	body2.internalApplyImpulse(c.m_contactNormal2*body2.internalGetInvMass(), c.m_angularComponentB, deltaImpulse);

	return deltaImpulse;
}